

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

shared_ptr<chaiscript::Boxed_Value::Data>
chaiscript::Boxed_Value::Object_Data::get<chaiscript::exception::arithmetic_error>
          (shared_ptr<chaiscript::exception::arithmetic_error> *obj,bool t_return_value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<chaiscript::exception::arithmetic_error,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  element_type *in_RDI;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  element_type *ptr;
  uint7 in_stack_ffffffffffffffb8;
  arithmetic_error **in_stack_ffffffffffffffc0;
  shared_ptr<chaiscript::exception::arithmetic_error> *in_stack_ffffffffffffffc8;
  Any *in_stack_ffffffffffffffd0;
  Type_Info *in_stack_ffffffffffffffd8;
  
  std::__shared_ptr<chaiscript::exception::arithmetic_error,_(__gnu_cxx::_Lock_policy)2>::get
            (in_RSI);
  chaiscript::detail::Get_Type_Info<chaiscript::exception::arithmetic_error>::get();
  chaiscript::detail::Any::Any<std::shared_ptr<chaiscript::exception::arithmetic_error>,void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::
  make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,chaiscript::exception::arithmetic_error*&,bool&>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(bool *)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0,(bool *)(ulong)in_stack_ffffffffffffffb8);
  chaiscript::detail::Any::~Any((Any *)0x3c2ba8);
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Data> get(std::shared_ptr<T> &&obj, bool t_return_value)
          {
            auto ptr = obj.get();
            return std::make_shared<Data>(
                  detail::Get_Type_Info<T>::get(), 
                  chaiscript::detail::Any(std::move(obj)), 
                  false,
                  ptr,
                  t_return_value
                );
          }